

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cpp
# Opt level: O0

Variable __thiscall LiteScript::State::GetArg(State *this,uint i)

{
  size_type sVar1;
  const_reference pvVar2;
  const_reference v;
  uint in_EDX;
  uint *extraout_RDX;
  undefined4 in_register_00000034;
  long lVar4;
  Variable VVar5;
  uint i_local;
  State *this_local;
  uint *puVar3;
  
  lVar4 = CONCAT44(in_register_00000034,i);
  sVar1 = std::
          vector<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
          ::size((vector<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                  *)(lVar4 + 0x48));
  if (sVar1 != 0) {
    pvVar2 = std::
             vector<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
             ::back((vector<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                     *)(lVar4 + 0x48));
    sVar1 = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::size(pvVar2);
    if (in_EDX < sVar1) {
      pvVar2 = std::
               vector<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
               ::back((vector<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                       *)(lVar4 + 0x48));
      v = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::at
                    (pvVar2,(ulong)in_EDX);
      Variable::Variable((Variable *)this,v);
      puVar3 = extraout_RDX;
      goto LAB_0015ddc8;
    }
  }
  VVar5 = Memory::Create((Memory *)this,*(Type **)(lVar4 + 0xd8));
  puVar3 = VVar5.nb_ref;
LAB_0015ddc8:
  VVar5.nb_ref = puVar3;
  VVar5.obj = (Object *)this;
  return VVar5;
}

Assistant:

LiteScript::Variable LiteScript::State::GetArg(unsigned int i) const {
    if (this->args_def.size() > 0 && this->args_def.back().size() > i)
        return Variable(this->args_def.back().at(i));
    else
        return this->memory.Create(Type::UNDEFINED);
}